

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

bool QMetaObject::invokeMethod
               (QObject *obj,char *member,ConnectionType type,void *param_4,char *param_5,
               undefined8 param_6,undefined8 param_7,undefined8 param_8,undefined8 param_9,
               undefined8 param_10,undefined8 param_11,undefined8 param_12,undefined8 param_13,
               undefined8 param_14,undefined8 param_15,undefined8 param_16,undefined8 param_17,
               undefined8 param_18,undefined8 param_19,undefined8 param_20,undefined8 param_21,
               undefined8 param_22,undefined8 param_23,undefined8 param_24,undefined8 param_25,
               undefined8 param_26)

{
  bool bVar1;
  size_t sVar2;
  long paramCount;
  long in_FS_OFFSET;
  void *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_98 [12];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (obj == (QObject *)0x0) {
    bVar1 = false;
  }
  else {
    local_98[1] = (char *)param_8;
    local_98[2] = (char *)param_10;
    local_98[3] = (char *)param_12;
    local_98[4] = (char *)param_14;
    local_98[5] = (char *)param_16;
    local_98[6] = (char *)param_18;
    local_98[7] = (char *)param_20;
    local_98[8] = (char *)param_22;
    local_98[9] = (char *)param_24;
    local_98[10] = (char *)param_26;
    local_f0 = param_7;
    local_e8 = param_9;
    local_e0 = param_11;
    local_d8 = param_13;
    local_d0 = param_15;
    local_c8 = param_17;
    local_c0 = param_19;
    local_b8 = param_21;
    local_b0 = param_23;
    local_a8 = param_25;
    local_f8 = param_4;
    local_98[0] = param_5;
    for (paramCount = 1; paramCount != 0xb; paramCount = paramCount + 1) {
      sVar2 = qstrlen(local_98[paramCount]);
      if (sVar2 == 0) break;
    }
    bVar1 = invokeMethodImpl(obj,member,type,paramCount,&local_f8,local_98,
                             (QMetaTypeInterface **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaObject::invokeMethod(QObject *obj,
                               const char *member,
                               Qt::ConnectionType type,
                               QGenericReturnArgument ret,
                               QGenericArgument val0,
                               QGenericArgument val1,
                               QGenericArgument val2,
                               QGenericArgument val3,
                               QGenericArgument val4,
                               QGenericArgument val5,
                               QGenericArgument val6,
                               QGenericArgument val7,
                               QGenericArgument val8,
                               QGenericArgument val9)
{
    if (!obj)
        return false;

    const char *typeNames[] = {ret.name(), val0.name(), val1.name(), val2.name(), val3.name(),
                               val4.name(), val5.name(), val6.name(), val7.name(), val8.name(),
                               val9.name()};
    const void *parameters[] = {ret.data(), val0.data(), val1.data(), val2.data(), val3.data(),
                                val4.data(), val5.data(), val6.data(), val7.data(), val8.data(),
                                val9.data()};
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeMethodImpl(obj, member, type, paramCount, parameters, typeNames, nullptr);
}